

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<QtGraphicsAnchorLayout::AnchorVertex_*> * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::uniqueKeys
          (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
           *this)

{
  long lVar1;
  bool bVar2;
  Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *res;
  iterator i;
  parameter_type t;
  Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  *this_00;
  iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->_vptr_AnchorVertex)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_item = (QGraphicsLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->m_edge = &DAT_aaaaaaaaaaaaaaaa;
  t = in_RDI;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::QList
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x947400);
  if (*(long *)in_RSI != 0) {
    QHashPrivate::
    Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
    ::begin((Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
             *)in_stack_ffffffffffffffb0.bucket);
    while( true ) {
      QHashPrivate::
      Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::end(in_RSI);
      this_00 = in_stack_ffffffffffffffb0.d;
      bVar2 = QHashPrivate::
              iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
              ::operator!=((iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                            *)t,in_stack_ffffffffffffffb0);
      if (!bVar2) break;
      QHashPrivate::
      iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::node((iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
              *)this_00);
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x947485,t);
      in_stack_ffffffffffffffb0 =
           QHashPrivate::
           iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
           ::operator++((iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                         *)in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<Key> uniqueKeys() const
    {
        QList<Key> res;
        if (d) {
            auto i = d->begin();
            while (i != d->end()) {
                res.append(i.node()->key);
                ++i;
            }
        }
        return res;
    }